

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O3

void __thiscall icu_63::LocaleKeyFactory::~LocaleKeyFactory(LocaleKeyFactory *this)

{
  (this->super_ICUServiceFactory).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleKeyFactory_0024bd70;
  UnicodeString::~UnicodeString(&this->_name);
  ICUServiceFactory::~ICUServiceFactory(&this->super_ICUServiceFactory);
  return;
}

Assistant:

UObject*
LocaleKeyFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        int32_t kind = lkey.kind();
        Locale loc;
        lkey.currentLocale(loc);

        return handleCreate(loc, kind, service, status);
    }
    return NULL;
}